

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

json __thiscall minja::Parser::parseNumber(Parser *this,CharIterator *it,CharIterator *end)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  runtime_error *this_00;
  bool bVar7;
  undefined8 *in_RCX;
  byte *pbVar8;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar9;
  json jVar10;
  string str;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  
  pcVar2 = end->_M_current;
  consumeSpaces((Parser *)it,Strip);
  pbVar3 = (byte *)end->_M_current;
  pbVar8 = pbVar3;
  if ((byte *)*in_RCX == pbVar3) {
    bVar4 = false;
    bVar7 = false;
  }
  else {
    bVar4 = false;
    if (*pbVar3 == 0x2d) {
      bVar5 = false;
      bVar6 = false;
      goto LAB_0017d2f3;
    }
    bVar7 = false;
    bVar5 = bVar7;
    bVar6 = bVar4;
    if (*pbVar3 == 0x2b) goto LAB_0017d2f3;
  }
  while (pbVar8 != (byte *)*in_RCX) {
    bVar1 = *pbVar8;
    bVar5 = bVar7;
    bVar6 = bVar4;
    if (9 < (int)(char)bVar1 - 0x30U) {
      if (bVar1 == 0x2e) {
        bVar5 = true;
        if (bVar7) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Multiple decimal points");
LAB_0017d364:
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        if ((pbVar8 == pbVar3) || ((bVar1 | 0x20) != 0x65)) break;
        bVar6 = true;
        if (bVar4) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Multiple exponents");
          goto LAB_0017d364;
        }
      }
    }
LAB_0017d2f3:
    bVar4 = bVar6;
    bVar7 = bVar5;
    end->_M_current = (char *)(pbVar8 + 1);
    pbVar8 = pbVar8 + 1;
  }
  if (pbVar8 == pbVar3) {
    end->_M_current = pcVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)this,(nullptr_t)0x0);
    jVar9 = extraout_RDX_00;
  }
  else {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>((string *)&str);
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string&>
              ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)this,&str,(parser_callback_t *)&local_e8,true,false);
    std::_Function_base::~_Function_base((_Function_base *)&local_e8);
    std::__cxx11::string::~string((string *)&str);
    jVar9 = extraout_RDX;
  }
  jVar10.m_data.m_value.object = jVar9.object;
  jVar10.m_data._0_8_ = this;
  return (json)jVar10.m_data;
}

Assistant:

json parseNumber(CharIterator& it, const CharIterator& end) {
        auto before = it;
        consumeSpaces();
        auto start = it;
        bool hasDecimal = false;
        bool hasExponent = false;

        if (it != end && (*it == '-' || *it == '+')) ++it;

        while (it != end) {
          if (std::isdigit(*it)) {
            ++it;
          } else if (*it == '.') {
            if (hasDecimal) throw std::runtime_error("Multiple decimal points");
            hasDecimal = true;
            ++it;
          } else if (it != start && (*it == 'e' || *it == 'E')) {
            if (hasExponent) throw std::runtime_error("Multiple exponents");
            hasExponent = true;
            ++it;
          } else {
            break;
          }
        }
        if (start == it) {
          it = before;
          return json(); // No valid characters found
        }

        std::string str(start, it);
        try {
          return json::parse(str);
        } catch (json::parse_error& e) {
          throw std::runtime_error("Failed to parse number: '" + str + "' (" + std::string(e.what()) + ")");
          return json();
        }
    }